

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::it_succeeded(info *this,string *desc)

{
  int *piVar1;
  _Elt_pointer pcVar2;
  ostream *poVar3;
  string local_80 [32];
  string local_60 [32];
  string local_40;
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_succeeded_;
  *piVar1 = *piVar1 + 1;
  pcVar2 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  pcVar2[-1].total = pcVar2[-1].total + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar3 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&local_40,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[2])(local_60);
  poVar3 = std::operator<<(poVar3,local_60);
  poVar3 = std::operator<<(poVar3,"[ PASS ]");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_80);
  poVar3 = std::operator<<(poVar3,local_80);
  poVar3 = std::operator<<(poVar3," it ");
  poVar3 = std::operator<<(poVar3,(string *)desc);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::ostream::flush();
  return;
}

Assistant:

void it_succeeded(const std::string& desc) override {
        progress_base::it_succeeded(desc);
        ++context_stack_.top().total;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.good()
            << "[ PASS ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }